

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  ssize_t sVar1;
  int *piVar2;
  undefined2 local_7c;
  uint16_t local_7a;
  int sentLength;
  sockaddr_in6 sin;
  msghdr msgHdr;
  size_t bufferCount_local;
  ENetBuffer *buffers_local;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  memset((void *)((long)&sin.sin6_addr.__in6_u + 0xc),0,0x38);
  if (address != (ENetAddress *)0x0) {
    memset(&local_7c,0,0x1c);
    local_7c = 10;
    local_7a = htons(address->port);
    sin._0_8_ = *(undefined8 *)&address->field_0;
    sin.sin6_addr.__in6_u._0_8_ = *(undefined8 *)((long)&address->field_0 + 8);
    sin._20_8_ = &local_7c;
  }
  sVar1 = sendmsg(socket,(msghdr *)((long)&sin.sin6_addr.__in6_u + 0xc),0x4000);
  address_local._4_4_ = (int)sVar1;
  if (address_local._4_4_ == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      address_local._4_4_ = 0;
    }
    else {
      address_local._4_4_ = -1;
    }
  }
  return address_local._4_4_;
}

Assistant:

int enet_socket_send(ENetSocket socket, const ENetAddress* address, const ENetBuffer* buffers, size_t bufferCount) {
	struct msghdr msgHdr;
	struct sockaddr_in6 sin;
	int sentLength;

	memset(&msgHdr, 0, sizeof(struct msghdr));

	if (address != NULL) {
		memset(&sin, 0, sizeof(struct sockaddr_in6));

		sin.sin6_family = AF_INET6;
		sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
		sin.sin6_addr = address->ipv6;
		msgHdr.msg_name = &sin;
		msgHdr.msg_namelen = sizeof(struct sockaddr_in6);
	}

	msgHdr.msg_iov = (struct iovec*)buffers;
	msgHdr.msg_iovlen = bufferCount;
	sentLength = sendmsg(socket, &msgHdr, MSG_NOSIGNAL);

	if (sentLength == -1) {
		if (errno == EWOULDBLOCK)
			return 0;

		ENET_LOG_ERROR("An error occurred sending data to socket. sendMsg result is negative, returned code is %i.", errno);
		return -1;
	}

	return sentLength;
}